

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

mbedtls_cipher_info_t *
mbedtls_cipher_info_from_values
          (mbedtls_cipher_id_t cipher_id,int key_bitlen,mbedtls_cipher_mode_t mode)

{
  mbedtls_cipher_definition_t *local_28;
  mbedtls_cipher_definition_t *def;
  mbedtls_cipher_mode_t mode_local;
  int key_bitlen_local;
  mbedtls_cipher_id_t cipher_id_local;
  
  local_28 = mbedtls_cipher_definitions;
  while( true ) {
    if (local_28->info == (mbedtls_cipher_info_t *)0x0) {
      return (mbedtls_cipher_info_t *)0x0;
    }
    if (((local_28->info->base->cipher == cipher_id) && (local_28->info->key_bitlen == key_bitlen))
       && (local_28->info->mode == mode)) break;
    local_28 = local_28 + 1;
  }
  return local_28->info;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_values( const mbedtls_cipher_id_t cipher_id,
                                              int key_bitlen,
                                              const mbedtls_cipher_mode_t mode )
{
    const mbedtls_cipher_definition_t *def;

    for( def = mbedtls_cipher_definitions; def->info != NULL; def++ )
        if( def->info->base->cipher == cipher_id &&
            def->info->key_bitlen == (unsigned) key_bitlen &&
            def->info->mode == mode )
            return( def->info );

    return( NULL );
}